

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O1

size_t __thiscall bidfx_public_api::tools::ByteBuffer::WriteLong(ByteBuffer *this,int64_t value)

{
  int iVar1;
  undefined4 extraout_var;
  uchar bytes [8];
  ulong local_8;
  
  local_8 = (ulong)value >> 0x38 | (value & 0xff000000000000U) >> 0x28 |
            (value & 0xff0000000000U) >> 0x18 | (value & 0xff00000000U) >> 8 |
            (value & 0xff000000U) << 8 | (value & 0xff0000U) << 0x18 | (value & 0xff00U) << 0x28 |
            value << 0x38;
  iVar1 = (*(this->super_InputStream)._vptr_InputStream[3])(this,&local_8,8);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t ByteBuffer::WriteLong(const int64_t value)
{
    uint64_t i = *(uint64_t*)&value;
    unsigned char bytes[8];
    bytes[0] = (unsigned char) (i >> 56);
    bytes[1] = (unsigned char) (i >> 48);
    bytes[2] = (unsigned char) (i >> 40);
    bytes[3] = (unsigned char) (i >> 32);
    bytes[4] = (unsigned char) (i >> 24);
    bytes[5] = (unsigned char) (i >> 16);
    bytes[6] = (unsigned char) (i >> 8);
    bytes[7] = (unsigned char) i;
    return WriteBytes(bytes, 8);
}